

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void fornum(LexState *ls,TString *varname,int line)

{
  byte bVar1;
  FuncState *fs_00;
  int iVar2;
  TString *pTVar3;
  int base;
  FuncState *fs;
  int line_local;
  TString *varname_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  bVar1 = fs_00->freereg;
  pTVar3 = luaX_newstring(ls,"(for state)",0xb);
  new_localvar(ls,pTVar3);
  pTVar3 = luaX_newstring(ls,"(for state)",0xb);
  new_localvar(ls,pTVar3);
  pTVar3 = luaX_newstring(ls,"(for state)",0xb);
  new_localvar(ls,pTVar3);
  new_localvar(ls,varname);
  checknext(ls,0x3d);
  exp1(ls);
  checknext(ls,0x2c);
  exp1(ls);
  iVar2 = testnext(ls,0x2c);
  if (iVar2 == 0) {
    luaK_int(fs_00,(uint)fs_00->freereg,1);
    luaK_reserveregs(fs_00,1);
  }
  else {
    exp1(ls);
  }
  adjustlocalvars(ls,3);
  forbody(ls,(uint)bVar1,line,1,0);
  return;
}

Assistant:

static void fornum (LexState *ls, TString *varname, int line) {
  /* fornum -> NAME = exp,exp[,exp] forbody */
  FuncState *fs = ls->fs;
  int base = fs->freereg;
  new_localvarliteral(ls, "(for state)");
  new_localvarliteral(ls, "(for state)");
  new_localvarliteral(ls, "(for state)");
  new_localvar(ls, varname);
  checknext(ls, '=');
  exp1(ls);  /* initial value */
  checknext(ls, ',');
  exp1(ls);  /* limit */
  if (testnext(ls, ','))
    exp1(ls);  /* optional step */
  else {  /* default step = 1 */
    luaK_int(fs, fs->freereg, 1);
    luaK_reserveregs(fs, 1);
  }
  adjustlocalvars(ls, 3);  /* control variables */
  forbody(ls, base, line, 1, 0);
}